

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void R_DrawVisSprite(vissprite_t *vis)

{
  short sVar1;
  int iVar2;
  FTexture *pFVar3;
  long *plVar4;
  undefined8 *puVar5;
  bool bVar6;
  double dVar7;
  ushort uVar8;
  ESPSResult EVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar11;
  fixed_t fVar12;
  int zz;
  int iVar13;
  Span *spans;
  Span *local_40;
  int local_38;
  int local_34;
  
  if (vis->sector == (sector_t *)0x0) {
    bVar6 = true;
    if (((vis->gpos).X == 0.0) && ((vis->gpos).Y == 0.0)) {
      bVar6 = (vis->gpos).Z != 0.0;
    }
  }
  else {
    bVar6 = false;
  }
  if ((vis->xscale != 0) && (vis->yscale != 0.0)) {
    dc_colormap = (vis->Style).colormap;
    EVar9 = R_SetPatchStyle((vis->Style).RenderStyle,
                            SUB84((double)(vis->Style).Alpha + 103079215104.0,0),vis->Translation,
                            vis->FillColor);
    if ((vis->Style).RenderStyle.AsDWORD == LegacyRenderStyles[8].AsDWORD) {
      dc_colormap = dc_colormap + (ulong)vis->ColormapNum * 0x100;
    }
    if (EVar9 != DontDraw) {
      if (EVar9 == DoDraw0) {
        uVar8 = vis->x1;
      }
      else {
        uVar8 = vis->x2 & 0xfffc;
      }
      pFVar3 = (vis->field_13).pic;
      dVar7 = (double)vis->yscale;
      dc_iscale = SUB84((double)(1.0 / vis->yscale) + 103079215104.0,0);
      fVar12 = (vis->field_14).field_0.startfrac;
      iVar2 = (vis->field_14).field_0.xiscale;
      dc_texturemid = (vis->field_14).field_0.texturemid;
      sprflipvert = (vis->renderflags & 2) != 0;
      spryscale = dVar7;
      if (sprflipvert) {
        dc_iscale = -dc_iscale;
        dc_texturemid = dc_texturemid - (double)pFVar3->Height;
        spryscale = -dVar7;
      }
      sprtopscreen = CenterY - dc_texturemid * dVar7;
      sVar1 = vis->x1;
      dc_x = (int)sVar1;
      local_38 = (int)vis->x2;
      if (sVar1 < vis->x2) {
        iVar13 = (int)(short)uVar8;
        if ((dc_x & 3U) != 0 && sVar1 < (short)uVar8) {
          do {
            iVar10 = (*pFVar3->_vptr_FTexture[2])(pFVar3,(ulong)(uint)(fVar12 >> 0x10),&local_40);
            if (((!bVar6) && (CurrentPortalInSkybox == false)) && ((ulong)portaldrawsegs.Count != 0)
               ) {
              lVar11 = 0;
              do {
                plVar4 = *(long **)((long)portaldrawsegs.Array + lVar11);
                if ((((int)plVar4[0x12] == CurrentPortalUniq) &&
                    (puVar5 = *(undefined8 **)(*plVar4 + 0x18),
                    1.52587890625e-05 <
                    (double)puVar5[3] * (*(double *)*puVar5 - (double)(vis->gpos).X) +
                    (double)puVar5[2] * ((double)(vis->gpos).Y - ((double *)*puVar5)[1]))) &&
                   (((short)plVar4[3] <= dc_x && (dc_x < *(short *)((long)plVar4 + 0x1a)))))
                goto LAB_00317540;
                lVar11 = lVar11 + 8;
              } while ((ulong)portaldrawsegs.Count << 3 != lVar11);
            }
            R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var,iVar10),local_40);
LAB_00317540:
            dc_x = dc_x + 1;
            fVar12 = fVar12 + iVar2;
          } while ((dc_x < iVar13) && ((dc_x & 3U) != 0));
        }
        if (dc_x < iVar13) {
          local_34 = iVar13;
          do {
            rt_initcols((BYTE *)0x0);
            iVar10 = 4;
            iVar13 = dc_x;
            do {
              dc_x = iVar13;
              iVar13 = (*pFVar3->_vptr_FTexture[2])(pFVar3,(ulong)(uint)(fVar12 >> 0x10),&local_40);
              if (((!bVar6) && (CurrentPortalInSkybox == false)) &&
                 ((ulong)portaldrawsegs.Count != 0)) {
                lVar11 = 0;
                do {
                  plVar4 = *(long **)((long)portaldrawsegs.Array + lVar11);
                  if ((((int)plVar4[0x12] == CurrentPortalUniq) &&
                      (puVar5 = *(undefined8 **)(*plVar4 + 0x18),
                      1.52587890625e-05 <
                      (double)puVar5[3] * (*(double *)*puVar5 - (double)(vis->gpos).X) +
                      (double)puVar5[2] * ((double)(vis->gpos).Y - ((double *)*puVar5)[1]))) &&
                     (((short)plVar4[3] <= dc_x && (dc_x < *(short *)((long)plVar4 + 0x1a)))))
                  goto LAB_00317658;
                  lVar11 = lVar11 + 8;
                } while ((ulong)portaldrawsegs.Count << 3 != lVar11);
              }
              R_DrawMaskedColumnHoriz((BYTE *)CONCAT44(extraout_var_00,iVar13),local_40);
LAB_00317658:
              fVar12 = fVar12 + iVar2;
              iVar10 = iVar10 + -1;
              iVar13 = dc_x + 1;
            } while (iVar10 != 0);
            iVar13 = dc_x + -3;
            dc_x = dc_x + 1;
            rt_draw4cols(iVar13);
          } while (dc_x < local_34);
        }
        if (dc_x < local_38) {
          do {
            iVar13 = (*pFVar3->_vptr_FTexture[2])(pFVar3,(ulong)(uint)(fVar12 >> 0x10),&local_40);
            if (((!bVar6) && (CurrentPortalInSkybox == false)) && ((ulong)portaldrawsegs.Count != 0)
               ) {
              lVar11 = 0;
              do {
                plVar4 = *(long **)((long)portaldrawsegs.Array + lVar11);
                if (((((int)plVar4[0x12] == CurrentPortalUniq) &&
                     (puVar5 = *(undefined8 **)(*plVar4 + 0x18),
                     1.52587890625e-05 <
                     (double)puVar5[3] * (*(double *)*puVar5 - (double)(vis->gpos).X) +
                     (double)puVar5[2] * ((double)(vis->gpos).Y - ((double *)*puVar5)[1]))) &&
                    ((short)plVar4[3] <= dc_x)) && (dc_x < *(short *)((long)plVar4 + 0x1a)))
                goto LAB_00317770;
                lVar11 = lVar11 + 8;
              } while ((ulong)portaldrawsegs.Count << 3 != lVar11);
            }
            R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var_01,iVar13),local_40);
LAB_00317770:
            dc_x = dc_x + 1;
            fVar12 = fVar12 + iVar2;
          } while (dc_x < local_38);
        }
      }
    }
    R_FinishSetPatchStyle();
    NetUpdate();
  }
  return;
}

Assistant:

void R_DrawVisSprite (vissprite_t *vis)
{
	const BYTE *pixels;
	const FTexture::Span *spans;
	fixed_t 		frac;
	FTexture		*tex;
	int				x2, stop4;
	fixed_t			xiscale;
	ESPSResult		mode;
	bool			ispsprite = (!vis->sector && vis->gpos != FVector3(0, 0, 0));

	if (vis->xscale == 0 || vis->yscale == 0)
	{ // scaled to 0; can't see
		return;
	}

	fixed_t centeryfrac = FLOAT2FIXED(CenterY);
	dc_colormap = vis->Style.colormap;

	mode = R_SetPatchStyle (vis->Style.RenderStyle, vis->Style.Alpha, vis->Translation, vis->FillColor);

	if (vis->Style.RenderStyle == LegacyRenderStyles[STYLE_Shaded])
	{ // For shaded sprites, R_SetPatchStyle sets a dc_colormap to an alpha table, but
	  // it is the brightest one. We need to get back to the proper light level for
	  // this sprite.
		dc_colormap += vis->ColormapNum << COLORMAPSHIFT;
	}

	if (mode != DontDraw)
	{
		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = vis->x1;
		}
		else	 // DoDraw1
		{
			// Up to four columns at a time
			stop4 = vis->x2 & ~3;
		}

		tex = vis->pic;
		spryscale = vis->yscale;
		sprflipvert = false;
		dc_iscale = FLOAT2FIXED(1 / vis->yscale);
		frac = vis->startfrac;
		xiscale = vis->xiscale;
		dc_texturemid = vis->texturemid;

		if (vis->renderflags & RF_YFLIP)
		{
			sprflipvert = true;
			spryscale = -spryscale;
			dc_iscale = -dc_iscale;
			dc_texturemid -= vis->pic->GetHeight();
			sprtopscreen = CenterY + dc_texturemid * spryscale;
		}
		else
		{
			sprflipvert = false;
			sprtopscreen = CenterY - dc_texturemid * spryscale;
		}

		dc_x = vis->x1;
		x2 = vis->x2;

		if (dc_x < x2)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					pixels = tex->GetColumn (frac >> FRACBITS, &spans);
					if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
						R_DrawMaskedColumnHoriz (pixels, spans);
					dc_x++;
					frac += xiscale;
				}
				rt_draw4cols (dc_x - 4);
			}

			while (dc_x < x2)
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}
		}
	}

	R_FinishSetPatchStyle ();

	NetUpdate ();
}